

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::SetInitialValues(UKF *this,MeasurementPackage *meas_package)

{
  double dVar1;
  Matrix<double,__1,__1,_0,__1,__1> *__ptr;
  DenseIndex DVar2;
  DenseIndex DVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  CoeffReturnType pdVar5;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar6;
  VectorXd *this_00;
  float fVar7;
  float fVar8;
  Scalar local_118;
  Scalar local_110;
  float local_108;
  float local_104;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_100;
  Scalar local_e0;
  double local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  
  local_110 = (Scalar)CONCAT44(local_110._4_4_,5);
  local_118 = (Scalar)CONCAT44(local_118._4_4_,5);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_100,(int *)&local_110,(int *)&local_118);
  __ptr = (Matrix<double,__1,__1,_0,__1,__1> *)
          (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)local_100.m_xpr;
  DVar2 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  DVar3 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_100.m_row;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_100.m_col;
  local_100.m_xpr = __ptr;
  local_100.m_row = DVar2;
  local_100.m_col = DVar3;
  free(__ptr);
  local_100.m_row = 0;
  local_100.m_col = 1;
  local_100.m_currentBlockRows = 1;
  *(this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       1.0;
  local_110 = 0.0;
  local_100.m_xpr = &this->P_;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_100,&local_110);
  local_118 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_118);
  local_e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_e0);
  local_d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_d0);
  local_30 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_30);
  local_38 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_38);
  local_40 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_40);
  local_48 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_48);
  local_50 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_50);
  local_58 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_58);
  local_60 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_60);
  local_68 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_68);
  local_70 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_70);
  local_78 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_78);
  local_80 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_80);
  local_88 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_88);
  local_90 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_90);
  local_98 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_98);
  local_a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_a0);
  local_a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_a8);
  local_b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_b0);
  local_b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_b8);
  local_c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_c0);
  local_c8 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_100);
  if (meas_package->sensor_type_ == LASER) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &meas_package->raw_measurements_,0);
    local_100.m_row = 0;
    local_100.m_col = 1;
    local_100.m_currentBlockRows = 1;
    *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         *pdVar5;
    local_100.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&this->x_;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &meas_package->raw_measurements_,1);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_100,
                        pdVar5);
    local_110 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar6,&local_110);
    local_118 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar6,&local_118);
    local_e0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_e0);
  }
  else {
    if (meas_package->sensor_type_ != RADAR) {
      return;
    }
    this_00 = &meas_package->raw_measurements_;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,0);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,1);
    fVar7 = (float)*pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,2);
    local_d8 = *pdVar5;
    local_104 = cosf(fVar7);
    local_104 = local_104 * (float)dVar1;
    fVar8 = sinf(fVar7);
    local_108 = cosf(fVar7);
    fVar7 = sinf(fVar7);
    local_100.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&this->x_;
    local_100.m_row = 0;
    local_100.m_col = 1;
    local_100.m_currentBlockRows = 1;
    *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)local_104;
    local_110 = (Scalar)(fVar8 * (float)dVar1);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_100,
                        &local_110);
    fVar7 = fVar7 * (float)local_d8;
    fVar8 = local_108 * (float)local_d8;
    local_118 = (Scalar)SQRT(fVar8 * fVar8 + fVar7 * fVar7);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar6,&local_118);
    local_e0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar6,&local_e0);
    local_d0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_d0);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_100);
  return;
}

Assistant:

void UKF::SetInitialValues(const MeasurementPackage meas_package) {

  // initialize state covariance matrix P 
  P_ = MatrixXd(5, 5);
  P_ <<   1, 0,  0,  0,  0,
          0,  1, 0,  0,  0,
          0,  0,  1, 0,  0,
          0,  0,  0,  1, 0,
          0,  0,  0,  0,  1;

  if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Convert radar from polar to cartesian coordinates and initialize state.
    float rho = meas_package.raw_measurements_(0);
    float phi = meas_package.raw_measurements_(1);
    float rhodot = meas_package.raw_measurements_(2);

    float px = rho * cos(phi);
    float py = rho * sin(phi);
    float vx = rhodot * cos(phi);
    float vy = rhodot * sin(phi);

    x_ << px,py,sqrt(vx*vx +vy*vy),0,0;

  } 

  else if (meas_package.sensor_type_ == MeasurementPackage::LASER) {

    // Initialize state.
    x_ << meas_package.raw_measurements_(0),meas_package.raw_measurements_(1),0,0,0;

  }

  return;

}